

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_data_checkpointer.cpp
# Opt level: O2

DatabaseInstance * __thiscall
duckdb::ColumnDataCheckpointData::GetDatabase(ColumnDataCheckpointData *this)

{
  ColumnData *pCVar1;
  
  pCVar1 = optional_ptr<duckdb::ColumnData,_true>::operator->(&this->col_data);
  return pCVar1->info->db->db;
}

Assistant:

DatabaseInstance &ColumnDataCheckpointData::GetDatabase() {
	return col_data->GetDatabase();
}